

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.cc
# Opt level: O3

string * __thiscall
iqxmlrpc::dump_response_abi_cxx11_(string *__return_storage_ptr__,iqxmlrpc *this,Response *response)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Value *this_00;
  Struct *this_01;
  Node param;
  XmlBuilder writer;
  Node fault_node;
  Node root;
  Value_type_to_xml value_xml_visitor;
  Node params;
  string local_e0;
  Value local_c0;
  XmlBuilder local_b0;
  undefined1 local_a0 [16];
  string local_90;
  Value_type_visitor local_70;
  XmlBuilder *local_68;
  undefined1 local_60;
  Struct local_58;
  
  XmlBuilder::XmlBuilder(&local_b0);
  XmlBuilder::Node::Node((Node *)(local_a0 + 8),&local_b0,"methodResponse");
  local_70._vptr_Value_type_visitor = (_func_int **)&PTR__Value_type_visitor_0018b2e0;
  local_60 = 1;
  local_68 = &local_b0;
  if (*(long *)this == 0) {
    XmlBuilder::Node::Node((Node *)local_a0,&local_b0,"fault");
    local_58.values._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_58.values._M_t._M_impl.super__Rb_tree_header._M_header;
    local_58.super_Value_type._vptr_Value_type = (_func_int **)&PTR__Struct_0018b000;
    local_58.values._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_58.values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58.values._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    paVar1 = &local_e0.field_2;
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    local_58.values._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_58.values._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"faultCode","");
    Value::Value(&local_c0,*(int *)(this + 0x10));
    Struct::insert(&local_58,&local_e0,&local_c0);
    Value::~Value(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"faultString","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,*(long *)(this + 0x18),
               *(long *)(this + 0x20) + *(long *)(this + 0x18));
    Value::Value(&local_c0,&local_90);
    Struct::insert(&local_58,&local_e0,&local_c0);
    Value::~Value(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    Value::Value((Value *)&local_e0,&local_58);
    Value::apply_visitor((Value *)&local_e0,&local_70);
    Value::~Value((Value *)&local_e0);
    Struct::~Struct(&local_58);
    this_01 = (Struct *)local_a0;
  }
  else {
    XmlBuilder::Node::Node((Node *)&local_58,&local_b0,"params");
    XmlBuilder::Node::Node((Node *)&local_e0,&local_b0,"param");
    this_00 = Response::value((Response *)this);
    Value::apply_visitor(this_00,&local_70);
    XmlBuilder::Node::~Node((Node *)&local_e0);
    this_01 = &local_58;
  }
  XmlBuilder::Node::~Node((Node *)this_01);
  XmlBuilder::stop(&local_b0);
  XmlBuilder::content_abi_cxx11_(__return_storage_ptr__,&local_b0);
  XmlBuilder::Node::~Node((Node *)(local_a0 + 8));
  XmlBuilder::~XmlBuilder(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::string
dump_response( const Response& response )
{
  XmlBuilder writer;
  XmlBuilder::Node root(writer, "methodResponse");
  Value_type_to_xml value_xml_visitor(writer, true);

  if (!response.is_fault()) {
    XmlBuilder::Node params(writer, "params");
    XmlBuilder::Node param(writer, "param");
    response.value().apply_visitor(value_xml_visitor);
  } else {
    XmlBuilder::Node fault_node(writer, "fault");
    Struct fault;
    fault.insert( "faultCode", response.fault_code() );
    fault.insert( "faultString", response.fault_string() );
    Value(fault).apply_visitor(value_xml_visitor);
  }

  writer.stop();
  return writer.content();
}